

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieGia.c
# Opt level: O3

int Abc_NtkFlattenHierarchyGia_rec
              (Gia_Man_t *pNew,Vec_Ptr_t *vSupers,Abc_Obj_t *pObj,Vec_Ptr_t *vBuffers)

{
  void *Entry;
  Abc_Ntk_t *pNtk;
  int iVar1;
  long *Entry_00;
  Abc_Obj_t *pObj_00;
  long lVar2;
  
  if ((pObj->field_6).iTemp != -1) {
    return (pObj->field_6).iTemp;
  }
  switch(*(uint *)&pObj->field_0x14 & 0xf) {
  case 2:
    Entry_00 = (long *)Vec_PtrPop(vSupers);
    if ((*(uint *)((long)Entry_00 + 0x14) & 0xf) != 9) {
LAB_00869b0c:
      __assert_fail("pObj->Type == ABC_OBJ_WHITEBOX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                    ,0x151,"Abc_Ntk_t *Abc_ObjModel(Abc_Obj_t *)");
    }
    if (*(int *)((long)Entry_00 + 0x1c) != *(int *)(*(long *)(Entry_00[7] + 0x28) + 4)) {
      __assert_fail("Abc_ObjFaninNum(pBox) == Abc_NtkPiNum(pModel)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieGia.c"
                    ,0x184,
                    "int Abc_NtkFlattenHierarchyGia_rec(Gia_Man_t *, Vec_Ptr_t *, Abc_Obj_t *, Vec_Ptr_t *)"
                   );
    }
    iVar1 = (pObj->field_5).iData;
    if (((long)iVar1 < 0) || (*(int *)((long)Entry_00 + 0x1c) <= iVar1)) {
      __assert_fail("pObj->iData >= 0 && pObj->iData < Abc_NtkPiNum(pModel)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieGia.c"
                    ,0x185,
                    "int Abc_NtkFlattenHierarchyGia_rec(Gia_Man_t *, Vec_Ptr_t *, Abc_Obj_t *, Vec_Ptr_t *)"
                   );
    }
    iVar1 = Abc_NtkFlattenHierarchyGia_rec
                      (pNew,vSupers,
                       *(Abc_Obj_t **)
                        (*(long *)(*(long *)(*Entry_00 + 0x20) + 8) +
                        (long)*(int *)(Entry_00[4] + (long)iVar1 * 4) * 8),vBuffers);
    Vec_PtrPush(vSupers,Entry_00);
    pObj_00 = pObj;
    break;
  case 3:
  case 4:
  case 6:
    iVar1 = Abc_NtkFlattenHierarchyGia_rec
                      (pNew,vSupers,(Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray],
                       vBuffers);
    goto LAB_00869af8;
  case 5:
    Entry = pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray];
    if ((*(uint *)((long)Entry + 0x14) & 0xf) != 10 && (*(uint *)((long)Entry + 0x14) & 0xe) != 8) {
      __assert_fail("Abc_ObjIsBox(pBox)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieGia.c"
                    ,400,
                    "int Abc_NtkFlattenHierarchyGia_rec(Gia_Man_t *, Vec_Ptr_t *, Abc_Obj_t *, Vec_Ptr_t *)"
                   );
    }
    Vec_PtrPush(vSupers,Entry);
    if ((*(uint *)((long)Entry + 0x14) & 0xf) != 9) goto LAB_00869b0c;
    pNtk = *(Abc_Ntk_t **)(*(long *)((long)Entry + 0x38) + 0x30);
    if (*(Abc_NtkFunc_t *)((long)Entry + 0x2c) != pNtk->ntkFunc) {
      __assert_fail("Abc_ObjFanoutNum(pBox) == Abc_NtkPoNum(pModel)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieGia.c"
                    ,0x194,
                    "int Abc_NtkFlattenHierarchyGia_rec(Gia_Man_t *, Vec_Ptr_t *, Abc_Obj_t *, Vec_Ptr_t *)"
                   );
    }
    iVar1 = (pObj->field_5).iData;
    if ((iVar1 < 0) || ((int)*(Abc_NtkFunc_t *)((long)Entry + 0x2c) <= iVar1)) {
      __assert_fail("pObj->iData >= 0 && pObj->iData < Abc_NtkPoNum(pModel)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieGia.c"
                    ,0x195,
                    "int Abc_NtkFlattenHierarchyGia_rec(Gia_Man_t *, Vec_Ptr_t *, Abc_Obj_t *, Vec_Ptr_t *)"
                   );
    }
    pObj_00 = Abc_NtkPo(pNtk,iVar1);
    iVar1 = Abc_NtkFlattenHierarchyGia_rec(pNew,vSupers,pObj_00,vBuffers);
    Vec_PtrPop(vSupers);
    break;
  case 7:
    if (0 < (pObj->vFanins).nSize) {
      lVar2 = 0;
      do {
        Abc_NtkFlattenHierarchyGia_rec
                  (pNew,vSupers,
                   (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar2]],vBuffers);
        lVar2 = lVar2 + 1;
      } while (lVar2 < (pObj->vFanins).nSize);
    }
    iVar1 = Abc_NodeStrashToGia(pNew,pObj);
    goto LAB_00869af8;
  default:
    __assert_fail("Abc_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieGia.c"
                  ,0x19d,
                  "int Abc_NtkFlattenHierarchyGia_rec(Gia_Man_t *, Vec_Ptr_t *, Abc_Obj_t *, Vec_Ptr_t *)"
                 );
  }
  if (vBuffers != (Vec_Ptr_t *)0x0) {
    Vec_PtrPush(vBuffers,pObj_00);
    iVar1 = Gia_ManAppendBuf(pNew,iVar1);
  }
LAB_00869af8:
  (pObj->field_6).iTemp = iVar1;
  return iVar1;
}

Assistant:

int Abc_NtkFlattenHierarchyGia_rec( Gia_Man_t * pNew, Vec_Ptr_t * vSupers, Abc_Obj_t * pObj, Vec_Ptr_t * vBuffers )
{
    Abc_Ntk_t * pModel;
    Abc_Obj_t * pBox, * pFanin;  
    int iLit, i;
    if ( pObj->iTemp != -1 )
        return pObj->iTemp;
    if ( Abc_ObjIsNet(pObj) || Abc_ObjIsPo(pObj) || Abc_ObjIsBi(pObj) )
        return (pObj->iTemp = Abc_NtkFlattenHierarchyGia_rec(pNew, vSupers, Abc_ObjFanin0(pObj), vBuffers));
    if ( Abc_ObjIsPi(pObj) )
    {
        pBox   = (Abc_Obj_t *)Vec_PtrPop( vSupers );
        pModel = Abc_ObjModel(pBox);
        //printf( "   Exiting %s\n", Abc_NtkName(pModel) );
        assert( Abc_ObjFaninNum(pBox) == Abc_NtkPiNum(pModel) );
        assert( pObj->iData >= 0 && pObj->iData < Abc_NtkPiNum(pModel) );
        pFanin = Abc_ObjFanin( pBox, pObj->iData );
        iLit   = Abc_NtkFlattenHierarchyGia_rec( pNew, vSupers, pFanin, vBuffers );
        Vec_PtrPush( vSupers, pBox );
        //if ( vBuffers ) Vec_PtrPush( vBuffers, pFanin ); // save BI
        if ( vBuffers ) Vec_PtrPush( vBuffers, pObj );   // save PI
        return (pObj->iTemp = (vBuffers ? Gia_ManAppendBuf(pNew, iLit) : iLit));
    }
    if ( Abc_ObjIsBo(pObj) )
    {
        pBox   = Abc_ObjFanin0(pObj);
        assert( Abc_ObjIsBox(pBox) );
        Vec_PtrPush( vSupers, pBox );
        pModel = Abc_ObjModel(pBox);
        //printf( "Entering %s\n", Abc_NtkName(pModel) );
        assert( Abc_ObjFanoutNum(pBox) == Abc_NtkPoNum(pModel) );
        assert( pObj->iData >= 0 && pObj->iData < Abc_NtkPoNum(pModel) );
        pFanin = Abc_NtkPo( pModel, pObj->iData );
        iLit   = Abc_NtkFlattenHierarchyGia_rec( pNew, vSupers, pFanin, vBuffers );
        Vec_PtrPop( vSupers );
        //if ( vBuffers ) Vec_PtrPush( vBuffers, pObj );   // save BO
        if ( vBuffers ) Vec_PtrPush( vBuffers, pFanin ); // save PO
        return (pObj->iTemp = (vBuffers ? Gia_ManAppendBuf(pNew, iLit) : iLit));
    }
    assert( Abc_ObjIsNode(pObj) );
    Abc_ObjForEachFanin( pObj, pFanin, i )
        Abc_NtkFlattenHierarchyGia_rec( pNew, vSupers, pFanin, vBuffers );
    return (pObj->iTemp = Abc_NodeStrashToGia( pNew, pObj ));
}